

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::Initialize
          (CSharedMemoryObject *this,CPalThread *pthr,CObjectAttributes *poa)

{
  DWORD DVar1;
  LPVOID pvVar2;
  void *pvVar3;
  SHMObjData *local_30;
  SHMObjData *psmod;
  CObjectAttributes *pCStack_20;
  PAL_ERROR palError;
  CObjectAttributes *poa_local;
  CPalThread *pthr_local;
  CSharedMemoryObject *this_local;
  
  psmod._4_4_ = 0;
  local_30 = (SHMObjData *)0x0;
  pCStack_20 = poa;
  poa_local = (CObjectAttributes *)pthr;
  pthr_local = (CPalThread *)this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x35);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pCStack_20 == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x36);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  psmod._4_4_ = CPalObjectBase::Initialize
                          (&this->super_CPalObjectBase,(CPalThread *)poa_local,pCStack_20);
  if (psmod._4_4_ == 0) {
    DVar1 = CPalString::GetStringLength(&(this->super_CPalObjectBase).m_oa.sObjectName);
    if (DVar1 != 0) {
      this->m_ObjectDomain = SharedObject;
      psmod._4_4_ = AllocateSharedDataItems(this,&this->m_shmod,&local_30);
      if ((psmod._4_4_ != 0) || (local_30 == (SHMObjData *)0x0)) goto LAB_0017feb1;
    }
    DVar1 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
    if (DVar1 != 0) {
      if (this->m_ObjectDomain == SharedObject) {
        if (local_30 == (SHMObjData *)0x0) {
          fprintf(_stderr,"] %s %s:%d","Initialize",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0x5e);
          fprintf(_stderr,"psmod should not be NULL");
          psmod._4_4_ = 0x54f;
          goto LAB_0017feb1;
        }
        pvVar2 = SHMPtrToPtr(local_30->shmObjSharedData);
        this->m_pvSharedData = pvVar2;
        if (this->m_pvSharedData == (VOID *)0x0) {
          fprintf(_stderr,"] %s %s:%d","Initialize",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0x66);
          fprintf(_stderr,"Unable to map shared data area\n");
          psmod._4_4_ = 0x54f;
          goto LAB_0017feb1;
        }
      }
      else {
        psmod._4_4_ = CSimpleDataLock::Initialize(&this->m_sdlSharedData);
        if (psmod._4_4_ != 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          goto LAB_0017feb1;
        }
        DVar1 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
        pvVar3 = InternalMalloc((ulong)DVar1);
        this->m_pvSharedData = pvVar3;
        if (this->m_pvSharedData == (VOID *)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          psmod._4_4_ = 0xe;
          goto LAB_0017feb1;
        }
      }
      pvVar3 = this->m_pvSharedData;
      DVar1 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
      memset(pvVar3,0,(ulong)DVar1);
    }
  }
LAB_0017feb1:
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return psmod._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::Initialize(
    CPalThread *pthr,
    CObjectAttributes *poa
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMObjData *psmod = NULL;

    _ASSERTE(NULL != pthr); 
    _ASSERTE(NULL != poa);

    ENTRY("CSharedMemoryObject::Initialize"
        "(this = %p, pthr = %p, poa = %p)\n",
        this,
        pthr,
        poa
        );

    palError = CPalObjectBase::Initialize(pthr, poa);
    if (NO_ERROR != palError)
    {
        goto InitializeExit;
    }

    //
    // If this is a named object it needs to go into the shared domain;
    // otherwise it remains local
    //

    if (0 != m_oa.sObjectName.GetStringLength())
    {   
        m_ObjectDomain = SharedObject;

        palError = AllocateSharedDataItems(&m_shmod, &psmod);
        if (NO_ERROR != palError || NULL == psmod)
        {
            goto InitializeExit;
        }
    }

    if (0 != m_pot->GetSharedDataSize())
    {       
        if (SharedObject == m_ObjectDomain)
        {
            //
            // Map the shared data into our address space
            //
            if (NULL == psmod)
            {
                ASSERT("psmod should not be NULL");
                palError = ERROR_INTERNAL_ERROR;
                goto InitializeExit;
            } 

            m_pvSharedData = SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjSharedData);
            if (NULL == m_pvSharedData)
            {
                ASSERT("Unable to map shared data area\n");
                palError = ERROR_INTERNAL_ERROR;
                goto InitializeExit;
            }
        }
        else 
        {
            //
            // Initialize the local shared data lock.
            //

            palError = m_sdlSharedData.Initialize();
            if (NO_ERROR != palError)
            {
                ERROR("Failure initializing m_sdlSharedData\n");
                goto InitializeExit;
            } 
        
            //
            // Allocate local memory to hold the shared data
            //

            m_pvSharedData = InternalMalloc(m_pot->GetSharedDataSize());
            if (NULL == m_pvSharedData)
            {
                ERROR("Failure allocating m_pvSharedData (local copy)\n");
                palError = ERROR_OUTOFMEMORY;
                goto InitializeExit;
            }
        }

        ZeroMemory(m_pvSharedData, m_pot->GetSharedDataSize());
    }


InitializeExit:

    LOGEXIT("CSharedMemoryObject::Initialize returns %d\n", palError);

    return palError;
}